

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringImpossiblyLarge_Test::TestBody
          (BlockSizes_ReadStringImpossiblyLarge_Test *this)

{
  bool bVar1;
  ParamType_conflict *pPVar2;
  char *message;
  char *in_R9;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  string str;
  undefined1 local_88 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  int kBlockSizes_case;
  BlockSizes_ReadStringImpossiblyLarge_Test *this_local;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*pPVar2);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_88,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  bVar1 = CodedInputStream::ReadString
                    ((CodedInputStream *)local_88,(string *)&gtest_ar_.message_,0x40000000);
  local_c9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_c8,
               (AssertionResult *)"coded_input.ReadString(&str, 1 << 30)","true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x311,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_88);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_P(BlockSizes, ReadStringImpossiblyLarge) {
  int kBlockSizes_case = GetParam();
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    std::string str;
    // Try to read a gigabyte.
    EXPECT_FALSE(coded_input.ReadString(&str, 1 << 30));
  }
}